

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strconv.c
# Opt level: O3

int jsonp_dtostr(char *buffer,size_t size,double value,int precision)

{
  uint uVar1;
  lconv *plVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  char *__src;
  char *pcVar6;
  char *pcVar7;
  
  uVar4 = 0x11;
  if (precision != 0) {
    uVar4 = (ulong)(uint)precision;
  }
  uVar1 = snprintf(buffer,size,"%.*g",uVar4);
  iVar5 = -1;
  if ((-1 < (int)uVar1) && (uVar4 = (ulong)uVar1, uVar4 < size)) {
    plVar2 = localeconv();
    if ((*plVar2->decimal_point != 0x2e) &&
       (pcVar3 = strchr(buffer,(int)*plVar2->decimal_point), pcVar3 != (char *)0x0)) {
      *pcVar3 = '.';
    }
    pcVar3 = strchr(buffer,0x2e);
    if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(buffer,0x65), pcVar3 == (char *)0x0)) {
      if (size <= uVar4 + 3) {
        return -1;
      }
      (buffer + uVar4)[0] = '.';
      (buffer + uVar4)[1] = '0';
      buffer[uVar4 + 2] = '\0';
      uVar4 = uVar4 + 2;
    }
    pcVar3 = strchr(buffer,0x65);
    if (pcVar3 != (char *)0x0) {
      pcVar6 = pcVar3 + (1 - uVar4);
      __src = pcVar3 + 1;
      do {
        pcVar6 = pcVar6 + 1;
        pcVar7 = __src + 1;
        __src = __src + 1;
      } while (*pcVar7 == '0');
      pcVar7 = pcVar3 + 1;
      if (pcVar3[1] == '-') {
        pcVar7 = pcVar3 + 2;
      }
      if (__src != pcVar7) {
        memmove(pcVar7,__src,(long)buffer - (long)pcVar6);
        uVar4 = (long)pcVar7 - (long)pcVar6;
      }
    }
    iVar5 = (int)uVar4;
  }
  return iVar5;
}

Assistant:

int jsonp_dtostr(char *buffer, size_t size, double value, int precision) {
    int ret;
    char *start, *end;
    size_t length;

    if (precision == 0)
        precision = 17;

    ret = snprintf(buffer, size, "%.*g", precision, value);
    if (ret < 0)
        return -1;

    length = (size_t) ret;
    if (length >= size)
        return -1;

#if JSON_HAVE_LOCALECONV
    from_locale(buffer);
#endif

    /* Make sure there's a dot or 'e' in the output. Otherwise
       a real is converted to an integer when decoding */
    if (strchr(buffer, '.') == NULL && strchr(buffer, 'e') == NULL) {
        if (length + 3 >= size) {
            /* No space to append ".0" */
            return -1;
        }
        buffer[length] = '.';
        buffer[length + 1] = '0';
        buffer[length + 2] = '\0';
        length += 2;
    }

    /* Remove leading '+' from positive exponent. Also remove leading
       zeros from exponents (added by some printf() implementations) */
    start = strchr(buffer, 'e');
    if (start) {
        start++;
        end = start + 1;

        if (*start == '-')
            start++;

        while (*end == '0')
            end++;

        if (end != start) {
            memmove(start, end, length - (size_t) (end - buffer));
            length -= (size_t) (end - start);
        }
    }

    return (int) length;
}